

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  size_t _elemsize;
  int *piVar3;
  int iVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  int iVar7;
  long lVar8;
  int j;
  ulong uVar9;
  int i_2;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  void *pvVar22;
  int i;
  void *pvVar23;
  int i_1;
  uint uVar24;
  ulong uVar25;
  int j_1;
  int k;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  void *local_f8;
  allocator_type local_e9;
  Mat local_e8;
  ulong local_a0;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  if (((this->super_Pooling).adaptive_pooling != 0) || (bottom_blob->elempack != 4)) {
    iVar4 = Pooling::forward(&this->super_Pooling,bottom_blob,top_blob,opt);
    return iVar4;
  }
  uVar2 = bottom_blob->c;
  uVar15 = (ulong)uVar2;
  _elemsize = bottom_blob->elemsize;
  if ((this->super_Pooling).global_pooling == 0) {
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.w = 0;
    local_e8.h = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    Pooling::make_padding(&this->super_Pooling,bottom_blob,&local_e8,opt);
    iVar6 = local_e8.w;
    iVar4 = -100;
    if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
      iVar10 = (local_e8.w - (this->super_Pooling).kernel_w) / (this->super_Pooling).stride_w;
      local_98 = CONCAT44(local_98._4_4_,local_e8.h);
      uVar25 = (long)(local_e8.h - (this->super_Pooling).kernel_h) /
               (long)(this->super_Pooling).stride_h;
      local_a0 = uVar25 & 0xffffffff;
      iVar11 = iVar10 + 1;
      Mat::create(top_blob,iVar11,(int)uVar25 + 1,uVar2,_elemsize,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar25 = (long)(this->super_Pooling).kernel_h * (long)(this->super_Pooling).kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar25,&local_e9);
        iVar4 = (this->super_Pooling).kernel_w;
        iVar7 = iVar6 - iVar4;
        iVar12 = 0;
        lVar8 = 0;
        for (iVar17 = 0; iVar19 = (this->super_Pooling).kernel_h, iVar17 < iVar19;
            iVar17 = iVar17 + 1) {
          for (lVar20 = 0; iVar19 = (int)lVar20, iVar19 < iVar4; lVar20 = lVar20 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar8 + lVar20] = iVar12 + iVar19;
            iVar4 = (this->super_Pooling).kernel_w;
          }
          iVar12 = iVar12 + iVar7 + iVar19;
          lVar8 = (int)lVar8 + lVar20;
        }
        iVar7 = (this->super_Pooling).pooling_type;
        iVar12 = (int)uVar25;
        if (iVar7 == 0) {
          uVar13 = (this->super_Pooling).stride_w ^ 2;
          uVar24 = (this->super_Pooling).stride_h ^ 2;
          if (((iVar19 == 2 && iVar4 == 2) && uVar13 == 0) && uVar24 == 0) {
            iVar4 = top_blob->w;
            uVar15 = 0;
            iVar6 = iVar4;
            if (iVar4 < 1) {
              iVar6 = 0;
            }
            iVar10 = top_blob->h;
            if (top_blob->h < 1) {
              iVar10 = 0;
            }
            uVar25 = (ulong)(uint)local_e8.c;
            if (local_e8.c < 1) {
              uVar25 = uVar15;
            }
            for (; uVar15 != uVar25; uVar15 = uVar15 + 1) {
              pvVar21 = (void *)(local_e8.cstep * uVar15 *
                                 CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                                (long)local_e8.data);
              pvVar22 = (void *)(top_blob->cstep * uVar15 * top_blob->elemsize +
                                (long)top_blob->data);
              pvVar23 = (void *)((long)local_e8.w *
                                 CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                                (long)pvVar21);
              for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
                lVar20 = 0;
                lVar8 = (long)((local_e8.w - iVar4) * 8) * -4;
                iVar7 = iVar6;
                while (bVar28 = iVar7 != 0, iVar7 = iVar7 + -1, bVar28) {
                  auVar30 = maxps(*(undefined1 (*) [16])((long)pvVar21 + lVar20 * 2 + 0x10),
                                  *(undefined1 (*) [16])((long)pvVar21 + lVar20 * 2));
                  auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar23 + lVar20 * 2 + 0x10),
                                  *(undefined1 (*) [16])((long)pvVar23 + lVar20 * 2));
                  auVar30 = maxps(auVar35,auVar30);
                  *(undefined1 (*) [16])((long)pvVar22 + lVar20) = auVar30;
                  lVar8 = lVar8 + -0x20;
                  lVar20 = lVar20 + 0x10;
                }
                pvVar21 = (void *)((long)pvVar21 - lVar8);
                pvVar23 = (void *)((long)pvVar23 - lVar8);
                pvVar22 = (void *)((long)pvVar22 + lVar20);
              }
            }
          }
          else if (((iVar19 == 3 && iVar4 == 3) && uVar13 == 0) && uVar24 == 0) {
            iVar4 = top_blob->w;
            uVar15 = 0;
            iVar6 = top_blob->h;
            if (top_blob->h < 1) {
              iVar6 = 0;
            }
            uVar2 = local_e8.c;
            if (local_e8.c < 1) {
              uVar2 = 0;
            }
            lVar8 = (long)((local_e8.w - iVar4) * 8) * 4;
            for (; uVar15 != uVar2; uVar15 = uVar15 + 1) {
              pvVar23 = (void *)(local_e8.cstep * uVar15 *
                                 CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                                (long)local_e8.data);
              pauVar5 = (undefined1 (*) [16])
                        (top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
              lVar20 = (long)local_e8.w *
                       CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
              pvVar21 = (void *)((long)pvVar23 + lVar20);
              pvVar22 = (void *)((long)pvVar23 + lVar20 * 2);
              for (iVar10 = 0; iVar10 != iVar6; iVar10 = iVar10 + 1) {
                lVar20 = 0;
                for (iVar11 = 0; iVar11 + 1 < iVar4; iVar11 = iVar11 + 2) {
                  auVar36 = maxps(*(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x10),
                                  *(undefined1 (*) [16])((long)pvVar23 + lVar20));
                  auVar30 = *(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x20);
                  auVar35 = *(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x20);
                  auVar41 = *(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x30);
                  auVar38 = maxps(*(undefined1 (*) [16])((long)pvVar21 + lVar20),auVar30);
                  auVar36 = maxps(auVar38,auVar36);
                  auVar39 = maxps(auVar36,*(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x10));
                  auVar36 = *(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x20);
                  auVar38 = *(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x30);
                  auVar37 = maxps(*(undefined1 (*) [16])((long)pvVar22 + lVar20),auVar35);
                  auVar40 = maxps(*(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x10),auVar36);
                  auVar37 = maxps(auVar40,auVar37);
                  auVar40 = maxps(auVar37,auVar39);
                  auVar37 = maxps(*(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x40),
                                  *(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x30));
                  auVar39 = maxps(*(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x40),
                                  *(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x40));
                  *pauVar5 = auVar40;
                  auVar30 = maxps(auVar41,auVar30);
                  auVar30 = maxps(auVar30,auVar37);
                  auVar41 = maxps(auVar38,auVar35);
                  auVar35 = maxps(auVar39,auVar36);
                  auVar30 = maxps(auVar35,auVar30);
                  auVar30 = maxps(auVar30,auVar41);
                  pauVar5[1] = auVar30;
                  pauVar5 = pauVar5 + 2;
                  lVar20 = lVar20 + 0x40;
                }
                for (; iVar11 < iVar4; iVar11 = iVar11 + 1) {
                  auVar30 = maxps(*(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x10),
                                  *(undefined1 (*) [16])((long)pvVar23 + lVar20));
                  auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar21 + lVar20),
                                  *(undefined1 (*) [16])((long)pvVar23 + lVar20 + 0x20));
                  auVar30 = maxps(auVar35,auVar30);
                  auVar30 = maxps(*(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x10),auVar30);
                  auVar35 = maxps(*(undefined1 (*) [16])((long)pvVar22 + lVar20),
                                  *(undefined1 (*) [16])((long)pvVar21 + lVar20 + 0x20));
                  auVar41 = maxps(*(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x20),
                                  *(undefined1 (*) [16])((long)pvVar22 + lVar20 + 0x10));
                  auVar35 = maxps(auVar41,auVar35);
                  auVar30 = maxps(auVar35,auVar30);
                  *pauVar5 = auVar30;
                  pauVar5 = pauVar5 + 1;
                  lVar20 = lVar20 + 0x20;
                }
                pvVar23 = (void *)((long)pvVar23 + lVar20 + lVar8);
                pvVar21 = (void *)((long)pvVar21 + lVar20 + lVar8);
                pvVar22 = (void *)((long)pvVar22 + lVar20 + lVar8);
              }
            }
          }
          else {
            uVar14 = 0;
            uVar25 = uVar25 & 0xffffffff;
            if (iVar12 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar15 = 0;
            }
            for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
              pvVar21 = (void *)(top_blob->cstep * uVar14 * top_blob->elemsize +
                                (long)top_blob->data);
              for (iVar4 = 0; iVar4 <= (int)local_a0; iVar4 = iVar4 + 1) {
                for (lVar8 = 0; lVar8 <= iVar10; lVar8 = lVar8 + 1) {
                  pauVar5 = (undefined1 (*) [16])
                            ((long)local_e8.data +
                            (long)((this->super_Pooling).stride_w * (int)lVar8 * 4) * 4 +
                            (long)(this->super_Pooling).stride_h * (long)iVar4 *
                            (long)local_e8.w *
                            CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                            local_e8.cstep * uVar14 *
                            CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                  auVar30 = *pauVar5;
                  for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                    auVar30 = maxps(auVar30,pauVar5[_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar26]
                                                   ]);
                  }
                  *(undefined1 (*) [16])((long)pvVar21 + lVar8 * 0x10) = auVar30;
                }
                pvVar21 = (void *)((long)pvVar21 + (long)(iVar11 * 4) * 4);
              }
            }
          }
        }
        else if (iVar7 == 1) {
          if ((this->super_Pooling).avgpool_count_include_pad == 0) {
            local_84 = 0;
            local_88 = 0;
            if ((this->super_Pooling).pad_mode == 0) {
              local_84 = (bottom_blob->w - local_e8.w) + (this->super_Pooling).pad_left +
                         (this->super_Pooling).pad_right;
              local_88 = (bottom_blob->h - local_e8.h) + (this->super_Pooling).pad_top +
                         (this->super_Pooling).pad_bottom;
            }
            local_88 = local_88 + (int)local_98;
            local_84 = local_84 + iVar6;
            local_78 = (long)(iVar11 * 4);
            local_98 = (long)iVar10;
            uVar25 = 0;
            if ((int)uVar2 < 1) {
              uVar15 = 0;
            }
            while (uVar14 = uVar25, uVar14 != uVar15) {
              local_58 = (long)local_e8.w;
              local_60 = local_e8.data;
              local_68 = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
              local_f8 = (void *)(top_blob->cstep * uVar14 * top_blob->elemsize +
                                 (long)top_blob->data);
              local_70 = local_e8.cstep * uVar14;
              iVar4 = 0;
              while (iVar6 = iVar4, iVar6 <= (int)local_a0) {
                lVar8 = (long)((this->super_Pooling).stride_h * iVar6);
                local_50 = (void *)((local_58 * lVar8 + local_70) * local_68 + (long)local_e8.data);
                for (lVar20 = 0; lVar20 <= local_98; lVar20 = lVar20 + 1) {
                  uVar2 = (this->super_Pooling).kernel_w;
                  uVar24 = (this->super_Pooling).kernel_h;
                  uVar26 = 0;
                  uVar25 = (ulong)uVar2;
                  if ((int)uVar2 < 1) {
                    uVar25 = uVar26;
                  }
                  uVar9 = (ulong)uVar24;
                  if ((int)uVar24 < 1) {
                    uVar9 = uVar26;
                  }
                  lVar18 = (long)((this->super_Pooling).stride_w * (int)lVar20);
                  pvVar21 = (void *)(lVar18 * 0x10 + (long)local_50);
                  auVar30 = ZEXT816(0);
                  iVar4 = 0;
                  for (; uVar26 != uVar9; uVar26 = uVar26 + 1) {
                    lVar16 = lVar8 + uVar26;
                    if ((this->super_Pooling).pad_top <= lVar16) {
                      if (local_88 - (this->super_Pooling).pad_bottom <= lVar16) break;
                      lVar16 = lVar18;
                      for (lVar27 = 0; uVar25 * 0x10 != lVar27; lVar27 = lVar27 + 0x10) {
                        auVar35 = auVar30;
                        if ((this->super_Pooling).pad_left <= lVar16) {
                          if (local_84 - (this->super_Pooling).pad_right <= lVar16) break;
                          auVar41 = *(undefined1 (*) [16])((long)pvVar21 + lVar27);
                          auVar35._0_4_ = auVar30._0_4_ + auVar41._0_4_;
                          auVar35._4_4_ = auVar30._4_4_ + auVar41._4_4_;
                          auVar35._8_4_ = auVar30._8_4_ + auVar41._8_4_;
                          auVar35._12_4_ = auVar30._12_4_ + auVar41._12_4_;
                          iVar4 = iVar4 + 1;
                        }
                        lVar16 = lVar16 + 1;
                        auVar30 = auVar35;
                      }
                    }
                    pvVar21 = (void *)((long)pvVar21 + local_68 * local_58);
                  }
                  fVar29 = 1.0 / (float)iVar4;
                  auVar41._0_4_ = fVar29 * auVar30._0_4_;
                  auVar41._4_4_ = fVar29 * auVar30._4_4_;
                  auVar41._8_4_ = fVar29 * auVar30._8_4_;
                  auVar41._12_4_ = fVar29 * auVar30._12_4_;
                  *(undefined1 (*) [16])((long)local_f8 + lVar20 * 0x10) = auVar41;
                }
                local_f8 = (void *)((long)local_f8 + local_78 * 4);
                local_8c = iVar6;
                iVar4 = iVar6 + 1;
              }
              local_80 = uVar14;
              uVar25 = uVar14 + 1;
            }
          }
          else {
            fVar29 = 1.0 / (float)iVar12;
            uVar14 = 0;
            uVar25 = uVar25 & 0xffffffff;
            if (iVar12 < 1) {
              uVar25 = 0;
            }
            if ((int)uVar2 < 1) {
              uVar15 = 0;
            }
            for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
              pvVar21 = (void *)(top_blob->cstep * uVar14 * top_blob->elemsize +
                                (long)top_blob->data);
              for (iVar4 = 0; iVar4 <= (int)local_a0; iVar4 = iVar4 + 1) {
                for (lVar8 = 0; lVar8 <= iVar10; lVar8 = lVar8 + 1) {
                  fVar31 = 0.0;
                  fVar32 = 0.0;
                  fVar33 = 0.0;
                  fVar34 = 0.0;
                  for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                    auVar30 = *(undefined1 (*) [16])
                               ((long)local_e8.data +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar26] * 0x10 +
                               (long)((this->super_Pooling).stride_w * (int)lVar8 * 4) * 4 +
                               (long)(this->super_Pooling).stride_h * (long)iVar4 *
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                               local_e8.cstep * uVar14 *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                    fVar31 = fVar31 + auVar30._0_4_;
                    fVar32 = fVar32 + auVar30._4_4_;
                    fVar33 = fVar33 + auVar30._8_4_;
                    fVar34 = fVar34 + auVar30._12_4_;
                  }
                  auVar30._0_4_ = fVar31 * fVar29;
                  auVar30._4_4_ = fVar32 * fVar29;
                  auVar30._8_4_ = fVar33 * fVar29;
                  auVar30._12_4_ = fVar34 * fVar29;
                  *(undefined1 (*) [16])((long)pvVar21 + lVar8 * 0x10) = auVar30;
                }
                pvVar21 = (void *)((long)pvVar21 + (long)(iVar11 * 4) * 4);
              }
            }
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
        iVar4 = 0;
      }
    }
    piVar3 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          free(local_e8.data);
        }
        else {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar6 = bottom_blob->w;
    iVar10 = bottom_blob->h;
    Mat::create(top_blob,uVar2,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      iVar4 = -100;
    }
    else {
      iVar4 = -100;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        uVar24 = iVar10 * iVar6;
        iVar6 = (this->super_Pooling).pooling_type;
        iVar4 = 0;
        if (iVar6 == 0) {
          uVar25 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
            lVar8 = bottom_blob->cstep * uVar14 * bottom_blob->elemsize;
            pauVar5 = (undefined1 (*) [16])((long)bottom_blob->data + lVar8);
            auVar30 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar8);
            uVar26 = uVar25;
            while (iVar6 = (int)uVar26, uVar26 = (ulong)(iVar6 - 1), iVar6 != 0) {
              auVar30 = maxps(auVar30,*pauVar5);
              pauVar5 = pauVar5 + 1;
            }
            *(undefined1 (*) [16])((long)top_blob->data + uVar14 * 0x10) = auVar30;
          }
        }
        else if (iVar6 == 1) {
          fVar29 = 1.0 / (float)(int)uVar24;
          iVar4 = 0;
          uVar25 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar25 = 0;
          }
          if ((int)uVar2 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
            pauVar5 = (undefined1 (*) [16])
                      (bottom_blob->cstep * uVar14 * bottom_blob->elemsize + (long)bottom_blob->data
                      );
            fVar31 = 0.0;
            fVar32 = 0.0;
            fVar33 = 0.0;
            fVar34 = 0.0;
            uVar26 = uVar25;
            while (iVar6 = (int)uVar26, uVar26 = (ulong)(iVar6 - 1), iVar6 != 0) {
              auVar30 = *pauVar5;
              fVar31 = fVar31 + auVar30._0_4_;
              fVar32 = fVar32 + auVar30._4_4_;
              fVar33 = fVar33 + auVar30._8_4_;
              fVar34 = fVar34 + auVar30._12_4_;
              pauVar5 = pauVar5 + 1;
            }
            pfVar1 = (float *)((long)top_blob->data + uVar14 * 0x10);
            *pfVar1 = fVar31 * fVar29;
            pfVar1[1] = fVar32 * fVar29;
            pfVar1[2] = fVar33 * fVar29;
            pfVar1[3] = fVar34 * fVar29;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}